

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void n_structure_suite::n_structure_null_byte_outside_string(void)

{
  basic_string_view<char,_std::char_traits<char>_> *this;
  undefined4 local_190;
  value local_18c [6];
  undefined4 local_174;
  value local_170 [2];
  undefined1 local_168 [8];
  reader reader;
  string_view view;
  char input [4];
  
  view._M_str._4_4_ = 0x5d005b;
  this = (basic_string_view<char,_std::char_traits<char>_> *)
         &reader.stack.c.
          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,(char *)((long)&view._M_str + 4),4);
  trial::protocol::json::basic_reader<char>::basic_reader((basic_reader<char> *)local_168,this);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_168);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x91d,"void n_structure_suite::n_structure_null_byte_outside_string()",local_170,
             &local_174);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_168);
  local_18c[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_168);
  local_190 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x91f,"void n_structure_suite::n_structure_null_byte_outside_string()",local_18c,
             &local_190);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_168);
  return;
}

Assistant:

void n_structure_null_byte_outside_string()
{
    const char input[] = "[\x00]";
    core::detail::string_view view(input, sizeof(input)); // Capture nil character
    json::reader reader(view);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}